

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O1

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetSegmentLocalRotationHelical
          (VClient *this,string *i_rSubjectName,string *i_rSegmentName,double (*o_rThreeVector) [3],
          bool *o_rbOccluded)

{
  Enum EVar1;
  long lVar2;
  scoped_lock Lock;
  double RotationArray [9];
  unique_lock<boost::recursive_mutex> local_88;
  double local_78 [9];
  
  local_88.m = &this->m_FrameMutex;
  local_88.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_88);
  lVar2 = 0;
  do {
    ClientUtils::Clear((double *)((long)*o_rThreeVector + lVar2));
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  ClientUtils::Clear(o_rbOccluded);
  EVar1 = GetSegmentLocalRotationMatrix(this,i_rSubjectName,i_rSegmentName,&local_78,o_rbOccluded);
  if ((EVar1 == Success) && (*o_rbOccluded == false)) {
    ClientUtils::MatrixToHelical(local_78,o_rThreeVector);
  }
  if (local_88.is_locked == true) {
    boost::recursive_mutex::unlock(local_88.m);
  }
  return EVar1;
}

Assistant:

Result::Enum VClient::GetSegmentLocalRotationHelical( const std::string & i_rSubjectName, 
                                                      const std::string & i_rSegmentName, 
                                                            double    ( & o_rThreeVector)[3], 
                                                            bool        & o_rbOccluded ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Clear( o_rThreeVector );
  Clear( o_rbOccluded );

  // Get the answer as a rotation matrix
  double RotationArray[ 9 ];
  const Result::Enum _Result = GetSegmentLocalRotationMatrix( i_rSubjectName, i_rSegmentName, RotationArray, o_rbOccluded );

  if( Result::Success == _Result && !o_rbOccluded )
  {
    MatrixToHelical( RotationArray, o_rThreeVector );
  }

  return _Result;
}